

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O0

RC __thiscall StatisticsMgr::Reset(StatisticsMgr *this,char *psKey)

{
  Boolean BVar1;
  int iVar2;
  Statistic *this_00;
  Statistic *pStat;
  int iCount;
  int i;
  char *psKey_local;
  StatisticsMgr *this_local;
  
  if (psKey == (char *)0x0) {
    this_local._4_4_ = 0x2329;
  }
  else {
    iVar2 = LinkList<Statistic>::GetLength(&this->llStats);
    for (pStat._4_4_ = 0; pStat._4_4_ < iVar2; pStat._4_4_ = pStat._4_4_ + 1) {
      this_00 = LinkList<Statistic>::operator[](&this->llStats,pStat._4_4_);
      BVar1 = Statistic::operator==(this_00,psKey);
      if (BVar1 != '\0') break;
    }
    if (pStat._4_4_ == iVar2) {
      this_local._4_4_ = 0x232a;
    }
    else {
      LinkList<Statistic>::Delete(&this->llStats,pStat._4_4_);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC StatisticsMgr::Reset(const char *psKey)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL)
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // If we found the statistic then remove it from the list
   if (i!=iCount)
      llStats.Delete(i);
   else
      return STAT_UNKNOWN_KEY;

   return 0;
}